

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

SourceFileFlags __thiscall
cmGeneratorTarget::GetTargetSourceFileFlags(cmGeneratorTarget *this,cmSourceFile *sf)

{
  cmSourceFile *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  iterator iVar4;
  _Base_ptr __s1;
  SourceFileFlags SVar5;
  ulong uStack_60;
  allocator<char> local_49;
  cmSourceFile *sf_local;
  string local_40;
  
  sf_local = sf;
  ConstructSourceFileFlags(this);
  iVar4 = std::
          _Rb_tree<const_cmSourceFile_*,_std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>,_std::_Select1st<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
          ::find(&(this->SourceFlagsMap)._M_t,&sf_local);
  this_00 = sf_local;
  if ((_Rb_tree_header *)iVar4._M_node == &(this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header
     ) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"MACOSX_PACKAGE_LOCATION",&local_49);
    __s1 = (_Base_ptr)cmSourceFile::GetProperty(this_00,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (__s1 == (_Base_ptr)0x0) {
      uStack_60 = 0;
      __s1 = (_Base_ptr)0x0;
    }
    else {
      iVar2 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x2a])
                        (this->GlobalGenerator,this->Makefile);
      iVar3 = strcmp((char *)__s1,"Resources");
      if (iVar3 == 0) {
        if ((char)iVar2 != '\0') {
          __s1 = (_Base_ptr)0x42ccbe;
        }
        uStack_60 = 3;
      }
      else {
        bVar1 = cmsys::SystemTools::StringStartsWith((char *)__s1,"Resources/");
        if (bVar1) {
          if ((char)iVar2 != '\0') {
            __s1 = (_Base_ptr)((long)&__s1->_M_parent + 2);
          }
          uStack_60 = 4;
        }
        else {
          uStack_60 = 5;
        }
      }
    }
  }
  else {
    uStack_60 = (ulong)*(uint *)&iVar4._M_node[1]._M_parent;
    __s1 = iVar4._M_node[1]._M_left;
  }
  SVar5.MacFolder = (char *)__s1;
  SVar5._0_8_ = uStack_60;
  return SVar5;
}

Assistant:

struct cmGeneratorTarget::SourceFileFlags
cmGeneratorTarget::GetTargetSourceFileFlags(const cmSourceFile* sf) const
{
  struct SourceFileFlags flags;
  this->ConstructSourceFileFlags();
  std::map<cmSourceFile const*, SourceFileFlags>::iterator si =
    this->SourceFlagsMap.find(sf);
  if (si != this->SourceFlagsMap.end()) {
    flags = si->second;
  } else {
    // Handle the MACOSX_PACKAGE_LOCATION property on source files that
    // were not listed in one of the other lists.
    if (const char* location = sf->GetProperty("MACOSX_PACKAGE_LOCATION")) {
      flags.MacFolder = location;
      const bool stripResources =
        this->GlobalGenerator->ShouldStripResourcePath(this->Makefile);
      if (strcmp(location, "Resources") == 0) {
        flags.Type = cmGeneratorTarget::SourceFileTypeResource;
        if (stripResources) {
          flags.MacFolder = "";
        }
      } else if (cmSystemTools::StringStartsWith(location, "Resources/")) {
        flags.Type = cmGeneratorTarget::SourceFileTypeDeepResource;
        if (stripResources) {
          flags.MacFolder += strlen("Resources/");
        }
      } else {
        flags.Type = cmGeneratorTarget::SourceFileTypeMacContent;
      }
    }
  }
  return flags;
}